

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O0

double __thiscall HDual::an_bs_cond(HDual *this,HModel *ptr_model)

{
  value_type vVar1;
  HMatrix *pHVar2;
  reference pvVar3;
  reference pvVar4;
  int *piVar5;
  double *pdVar6;
  undefined8 in_RSI;
  long in_RDI;
  vector<double,_std::allocator<double>_> *pvVar7;
  undefined8 uVar8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double cond_B;
  int el_n;
  double c_norm;
  int vr_n;
  int r_n_6;
  double norm_B;
  int r_n_5;
  double abs_z_v;
  int r_n_4;
  int argmax_z;
  double ztx;
  double norm_z;
  int r_n_3;
  int r_n_2;
  int ps_n;
  int r_n_1;
  int r_n;
  double norm_Binv;
  double mu;
  double NoDensity;
  double *Avalue;
  int *Astart;
  undefined4 in_stack_ffffffffffffff10;
  value_type in_stack_ffffffffffffff14;
  HVector *in_stack_ffffffffffffff18;
  HFactor *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  int iVar9;
  HVector *in_stack_ffffffffffffff30;
  int local_94;
  double local_90;
  int local_88;
  int local_84;
  double local_80;
  int local_74;
  int local_68;
  value_type local_64;
  double local_60;
  double local_58;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  double local_38;
  value_type local_30;
  undefined8 local_28;
  double *local_20;
  int *local_18;
  
  *(undefined8 *)(in_RDI + 0x60) = in_RSI;
  pHVar2 = HModel::getMatrix(*(HModel **)(in_RDI + 0x60));
  *(HMatrix **)(in_RDI + 0x88) = pHVar2;
  local_18 = HMatrix::getAstart((HMatrix *)0x147e14);
  local_20 = HMatrix::getAvalue((HMatrix *)0x147e30);
  local_28 = 0x3ff0000000000000;
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff30,
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff30,
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff30,
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff30,
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  local_30 = 1.0 / (double)*(int *)(in_RDI + 0x7c);
  for (local_3c = 0; vVar1 = local_30, local_3c < *(int *)(in_RDI + 0x7c); local_3c = local_3c + 1)
  {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xf8),(long)local_3c);
    *pvVar3 = vVar1;
  }
  HVector::clear(in_stack_ffffffffffffff30);
  *(undefined4 *)(in_RDI + 0x164) = *(undefined4 *)(in_RDI + 0x7c);
  for (local_40 = 0; iVar9 = local_40, local_40 < *(int *)(in_RDI + 0x7c); local_40 = local_40 + 1)
  {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x168),(long)local_40);
    *pvVar4 = iVar9;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xf8),(long)local_40);
    vVar1 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x180),(long)local_40);
    *pvVar3 = vVar1;
  }
  for (local_44 = 1; local_44 < 6; local_44 = local_44 + 1) {
    *(undefined1 *)(in_RDI + 0x1e0) = 0;
    HFactor::ftran(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                   (double)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    for (local_48 = 0; local_48 < *(int *)(in_RDI + 0x7c); local_48 = local_48 + 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x180),(long)local_48
                         );
      vVar1 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x110),(long)local_48
                         );
      *pvVar3 = vVar1;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x110),(long)local_48
                         );
      if (*pvVar3 <= 0.0) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x110),
                            (long)local_48);
        if (0.0 < *pvVar3 || *pvVar3 == 0.0) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x140),
                              (long)local_48);
          *pvVar3 = 0.0;
        }
        else {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x140),
                              (long)local_48);
          *pvVar3 = -1.0;
        }
      }
      else {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x140),
                            (long)local_48);
        *pvVar3 = 1.0;
      }
    }
    HVector::clear(in_stack_ffffffffffffff30);
    *(undefined4 *)(in_RDI + 0x164) = *(undefined4 *)(in_RDI + 0x7c);
    for (local_4c = 0; local_4c < *(int *)(in_RDI + 0x7c); local_4c = local_4c + 1) {
      iVar9 = local_4c;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x168),(long)local_4c);
      *pvVar4 = iVar9;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x140),(long)local_4c
                         );
      in_stack_ffffffffffffff30 = (HVector *)*pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x180),(long)local_4c
                         );
      *pvVar3 = (value_type)in_stack_ffffffffffffff30;
    }
    *(undefined1 *)(in_RDI + 0x1e0) = 0;
    HFactor::btran(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                   (double)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    local_58 = 0.0;
    local_60 = 0.0;
    local_38 = 0.0;
    local_64 = -1;
    for (local_68 = 0; local_68 < *(int *)(in_RDI + 0x7c); local_68 = local_68 + 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x180),(long)local_68
                         );
      in_stack_ffffffffffffff20 = (HFactor *)*pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x128),(long)local_68
                         );
      *pvVar3 = (value_type)in_stack_ffffffffffffff20;
      pvVar7 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x128);
      std::vector<double,_std::allocator<double>_>::operator[](pvVar7,(long)local_68);
      std::abs((int)pvVar7);
      if (local_58 < extraout_XMM0_Qa) {
        local_64 = local_68;
        local_58 = extraout_XMM0_Qa;
      }
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x128),(long)local_68
                         );
      in_stack_ffffffffffffff18 = (HVector *)*pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xf8),(long)local_68)
      ;
      local_60 = (double)in_stack_ffffffffffffff18 * *pvVar3 + local_60;
      pvVar7 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x110);
      std::vector<double,_std::allocator<double>_>::operator[](pvVar7,(long)local_68);
      std::abs((int)pvVar7);
      local_38 = extraout_XMM0_Qa_00 + local_38;
    }
    if (local_58 <= local_60) break;
    for (local_74 = 0; local_74 < *(int *)(in_RDI + 0x7c); local_74 = local_74 + 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xf8),(long)local_74)
      ;
      *pvVar3 = 0.0;
    }
    HVector::clear(in_stack_ffffffffffffff30);
    *(undefined4 *)(in_RDI + 0x164) = 1;
    in_stack_ffffffffffffff14 = local_64;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x168),0);
    *pvVar4 = in_stack_ffffffffffffff14;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x180),(long)local_64);
    *pvVar3 = 1.0;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xf8),(long)local_64);
    *pvVar3 = 1.0;
  }
  local_80 = 0.0;
  for (local_84 = 0; local_84 < *(int *)(in_RDI + 0x7c); local_84 = local_84 + 1) {
    uVar8 = *(undefined8 *)(in_RDI + 0x60);
    piVar5 = HModel::getBaseIndex((HModel *)0x148551);
    local_88 = piVar5[local_84];
    local_90 = 0.0;
    if (local_88 < *(int *)(in_RDI + 0x78)) {
      for (local_94 = local_18[local_88]; local_94 < local_18[local_88 + 1]; local_94 = local_94 + 1
          ) {
        std::abs((int)uVar8);
        local_90 = extraout_XMM0_Qa_01 + local_90;
      }
    }
    else {
      local_90 = 1.0;
    }
    pdVar6 = std::max<double>(&local_90,&local_80);
    local_80 = *pdVar6;
  }
  return local_38 * local_80;
}

Assistant:

double HDual::an_bs_cond(HModel *ptr_model) {
  model = ptr_model;
  // Alias to the matrix
  matrix = model->getMatrix();
  const int *Astart = matrix->getAstart();
  const double *Avalue = matrix->getAvalue();
  //Compute the Hager condition number estimate for the basis matrix
  double NoDensity = 1;
  bs_cond_x.resize(numRow);
  bs_cond_y.resize(numRow);
  bs_cond_z.resize(numRow);
  bs_cond_w.resize(numRow);
  //x = ones(n,1)/n;
  //y = A\x;
  double mu = 1.0/numRow;
  double norm_Binv;
  for (int r_n=0; r_n < numRow; r_n++) bs_cond_x[r_n] = mu;
  row_ep.clear();
  row_ep.count = numRow;
  for (int r_n=0; r_n < numRow; r_n++) {
    row_ep.index[r_n] = r_n;
    row_ep.array[r_n] = bs_cond_x[r_n];
  }
  for (int ps_n=1; ps_n <= 5; ps_n++) {
    row_ep.packFlag = false;
    factor->ftran(row_ep, NoDensity);
  //zeta = sign(y);
    for (int r_n=0; r_n < numRow; r_n++) {
      bs_cond_y[r_n] = row_ep.array[r_n];
      if (bs_cond_y[r_n] > 0)
	bs_cond_w[r_n] =  1.0;
      else if (bs_cond_y[r_n] < 0)
	bs_cond_w[r_n] = -1.0;
      else	  
        bs_cond_w[r_n] =  0.0;
    }
  //z=A'\zeta;
    row_ep.clear();
    row_ep.count = numRow;
    for (int r_n=0; r_n < numRow; r_n++) {
      row_ep.index[r_n] = r_n;
      row_ep.array[r_n] = bs_cond_w[r_n];
    }
    row_ep.packFlag = false;
    factor->btran(row_ep, NoDensity);
  //norm_z = norm(z,'inf');
  //ztx = z'*x ;
  //NormEst = norm(y,1);
  //fd_i = 0;
  //for i=1:n
  //    if abs(z(i)) == norm_z
  //        fd_i = i;
  //        break
  //    end
  //end
    double norm_z = 0.0;
    double ztx = 0.0;
    norm_Binv = 0.0;
    int argmax_z = -1;
    for (int r_n=0; r_n < numRow; r_n++) {
      bs_cond_z[r_n] = row_ep.array[r_n];
      double abs_z_v = abs(bs_cond_z[r_n]);
	if (abs_z_v > norm_z) {
	  norm_z = abs_z_v;
	  argmax_z = r_n;
	}
      ztx += bs_cond_z[r_n]*bs_cond_x[r_n];
      norm_Binv += abs(bs_cond_y[r_n]);
    }
    //printf("%2d: ||z||_inf = %8.2g; z^T*x = %8.2g; ||y||_1 = %g\n", ps_n, norm_z, ztx, norm_Binv);
    if (norm_z <= ztx) break;
  //x = zeros(n,1);
  //x(fd_i) = 1;
    for (int r_n=0; r_n < numRow; r_n++) bs_cond_x[r_n] = 0.0;
    row_ep.clear();
    row_ep.count = 1;
    row_ep.index[0] = argmax_z;
    row_ep.array[argmax_z] = 1.0;
    bs_cond_x[argmax_z] = 1.0;
  }
  double norm_B = 0.0;
  for (int r_n=0; r_n < numRow; r_n++) {
    int vr_n = model->getBaseIndex()[r_n];
    double c_norm = 0.0;
    if (vr_n < numCol) 
      for (int el_n=Astart[vr_n]; el_n < Astart[vr_n+1]; el_n++) c_norm += abs(Avalue[el_n]);
    else 
      c_norm += 1.0;
    norm_B = max(c_norm, norm_B);
  }
  double cond_B = norm_Binv * norm_B;
 // printf("Hager estimate of ||B^{-1}||_1 = %g; ||B||_1 = %g so cond_1(B) estimate is %g\n", norm_Binv, norm_B, cond_B);
  return cond_B;
}